

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMMemoryCopyFillLowering.cpp
# Opt level: O2

void __thiscall
wasm::LLVMMemoryCopyFillLowering::createMemoryFillFunc
          (LLVMMemoryCopyFillLowering *this,Module *module)

{
  MixedArena *this_00;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var1;
  undefined8 uVar2;
  char *pcVar3;
  IString memoryName;
  IString memory;
  Block *pBVar4;
  LocalGet *pLVar5;
  LocalGet *pLVar6;
  Binary *pBVar7;
  MemorySize *left;
  Const *pCVar8;
  Binary *right;
  Expression *ifTrue;
  If *item;
  Unary *condition;
  Block *pBVar9;
  Loop *first;
  Function *pFVar10;
  ulong extraout_RDX;
  ulong in_R8;
  ulong uVar11;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  initializer_list<wasm::Expression_*> local_e8;
  string_view local_d8;
  string_view local_c8;
  Break *local_b8;
  LocalSet *local_b0;
  Store *local_a8;
  Break *local_a0;
  string_view local_98;
  string_view local_88;
  undefined8 local_78;
  char *pcStack_70;
  Builder local_68;
  Builder b;
  
  _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((module->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
  uVar2 = *(undefined8 *)
           _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  pcVar3 = *(char **)((long)_Var1._M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
  memory.str = *(string_view *)
                _Var1._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  memoryName.str =
       *(string_view *)
        _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  this_00 = &module->allocator;
  local_68.wasm = module;
  b.wasm = (Module *)this;
  pBVar4 = MixedArena::alloc<wasm::Block>(this_00);
  pLVar5 = MixedArena::alloc<wasm::LocalGet>(this_00);
  pLVar5->index = 0;
  (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>(this_00);
  pLVar6->index = 2;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  pBVar7 = Builder::makeBinary(&local_68,AddInt32,(Expression *)pLVar5,(Expression *)pLVar6);
  left = Builder::makeMemorySize(&local_68,(Name)memoryName.str,Unspecified);
  pCVar8 = Builder::makeConst<unsigned_int>(&local_68,0x10000);
  right = Builder::makeBinary(&local_68,MulInt32,(Expression *)left,(Expression *)pCVar8);
  pBVar7 = Builder::makeBinary(&local_68,GtUInt32,(Expression *)pBVar7,(Expression *)right);
  ifTrue = (Expression *)MixedArena::alloc<wasm::Unreachable>(&(local_68.wasm)->allocator);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
  item = Builder::makeIf(&local_68,(Expression *)pBVar7,ifTrue,(Expression *)0x0,type);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(pBVar4->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  Name::Name((Name *)&local_98,"out");
  Name::Name((Name *)&local_88,"copy");
  Name::Name((Name *)&local_d8,"out");
  pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_68.wasm)->allocator);
  pLVar5->index = 2;
  (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  condition = Builder::makeUnary(&local_68,EqZInt32,(Expression *)pLVar5);
  local_b8 = Builder::makeBreak(&local_68,(Name)local_d8,(Expression *)0x0,(Expression *)condition);
  pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_68.wasm)->allocator);
  pLVar5->index = 2;
  (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  pCVar8 = Builder::makeConst<int>(&local_68,1);
  pBVar7 = Builder::makeBinary(&local_68,SubInt32,(Expression *)pLVar5,(Expression *)pCVar8);
  local_b0 = Builder::makeLocalSet(&local_68,2,(Expression *)pBVar7);
  pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_68.wasm)->allocator);
  pLVar5->index = 0;
  (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_68.wasm)->allocator);
  pLVar6->index = 2;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  pBVar7 = Builder::makeBinary(&local_68,AddInt32,(Expression *)pLVar5,(Expression *)pLVar6);
  pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_68.wasm)->allocator);
  pLVar5->index = 1;
  (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
  local_78 = uVar2;
  pcStack_70 = pcVar3;
  local_a8 = Builder::makeStore(&local_68,1,(Address)0x0,1,(Expression *)pBVar7,(Expression *)pLVar5
                                ,(Type)0x2,(Name)memory.str);
  Name::Name((Name *)&local_c8,"copy");
  uVar11 = 0;
  local_a0 = Builder::makeBreak(&local_68,(Name)local_c8,(Expression *)0x0,(Expression *)0x0);
  local_e8._M_len = 4;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  local_e8._M_array = (iterator)&local_b8;
  pBVar9 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                     (&local_68,&local_e8,type_01);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
  first = Builder::makeLoop(&local_68,(Name)local_88,(Expression *)pBVar9,type_00);
  pBVar9 = Builder::makeBlock(&local_68,(Name)local_98,(Expression *)first);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(pBVar4->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pBVar9);
  pFVar10 = Module::getFunction(module,(IString)*(IString *)
                                                 &((b.wasm)->debugInfoFile)._M_string_length);
  pFVar10->body = (Expression *)pBVar4;
  return;
}

Assistant:

void createMemoryFillFunc(Module* module) {
    Builder b(*module);
    Index dst = 0, val = 1, size = 2;
    Name memory = module->memories.front()->name;
    Block* body = b.makeBlock();

    // if dst + size > memsize in bytes, then trap.
    body->list.push_back(
      b.makeIf(b.makeBinary(BinaryOp::GtUInt32,
                            b.makeBinary(BinaryOp::AddInt32,
                                         b.makeLocalGet(dst, Type::i32),
                                         b.makeLocalGet(size, Type::i32)),
                            b.makeBinary(BinaryOp::MulInt32,
                                         b.makeMemorySize(memory),
                                         b.makeConst(Memory::kPageSize))),
               b.makeUnreachable()));

    body->list.push_back(b.makeBlock(
      "out",
      b.makeLoop(
        "copy",
        b.makeBlock(
          {// break if size == 0
           b.makeBreak(
             "out",
             nullptr,
             b.makeUnary(UnaryOp::EqZInt32, b.makeLocalGet(size, Type::i32))),
           // size--
           b.makeLocalSet(size,
                          b.makeBinary(BinaryOp::SubInt32,
                                       b.makeLocalGet(size, Type::i32),
                                       b.makeConst(1))),
           // *(dst+size) = val
           b.makeStore(1,
                       0,
                       1,
                       b.makeBinary(BinaryOp::AddInt32,
                                    b.makeLocalGet(dst, Type::i32),
                                    b.makeLocalGet(size, Type::i32)),
                       b.makeLocalGet(val, Type::i32),
                       Type::i32,
                       memory),
           b.makeBreak("copy", nullptr)}))));
    module->getFunction(memFillFuncName)->body = body;
  }